

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O0

Result<wallet::SelectionResult> *
wallet::AttemptSelection
          (Chain *chain,CAmount *nTargetValue,OutputGroupTypeMap *groups,
          CoinSelectionParams *coin_selection_params,bool allow_mixed_output_types)

{
  long lVar1;
  __normal_iterator<wallet::SelectionResult_*,_std::vector<wallet::SelectionResult,_std::allocator<wallet::SelectionResult>_>_>
  __first;
  bool bVar2;
  bool bVar3;
  size_type sVar4;
  Result<wallet::SelectionResult> *in_RDI;
  byte in_R9B;
  long in_FS_OFFSET;
  type *group;
  type *type;
  map<OutputType,_wallet::Groups,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_wallet::Groups>_>_>
  *__range1;
  Result<wallet::SelectionResult> *result;
  iterator __end1;
  iterator __begin1;
  vector<wallet::SelectionResult,_std::allocator<wallet::SelectionResult>_> results;
  SelectionResult *in_stack_fffffffffffffe58;
  value_type *in_stack_fffffffffffffe60;
  Error *error;
  SelectionResult *in_stack_fffffffffffffe68;
  Result<wallet::SelectionResult> *in_stack_fffffffffffffe78;
  __normal_iterator<wallet::SelectionResult_*,_std::vector<wallet::SelectionResult,_std::allocator<wallet::SelectionResult>_>_>
  in_stack_fffffffffffffe80;
  undefined7 in_stack_fffffffffffffe88;
  undefined1 in_stack_fffffffffffffe8f;
  Error local_b8;
  CoinSelectionParams *in_stack_ffffffffffffff88;
  Groups *in_stack_ffffffffffffff90;
  CAmount *in_stack_ffffffffffffff98;
  Chain *in_stack_ffffffffffffffa0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<wallet::SelectionResult,_std::allocator<wallet::SelectionResult>_>::vector
            ((vector<wallet::SelectionResult,_std::allocator<wallet::SelectionResult>_> *)
             in_stack_fffffffffffffe58);
  std::
  map<OutputType,_wallet::Groups,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_wallet::Groups>_>_>
  ::begin((map<OutputType,_wallet::Groups,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_wallet::Groups>_>_>
           *)in_stack_fffffffffffffe60);
  std::
  map<OutputType,_wallet::Groups,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_wallet::Groups>_>_>
  ::end((map<OutputType,_wallet::Groups,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_wallet::Groups>_>_>
         *)in_stack_fffffffffffffe60);
  while (bVar2 = std::operator==((_Self *)in_stack_fffffffffffffe68,
                                 (_Self *)in_stack_fffffffffffffe60), ((bVar2 ^ 0xffU) & 1) != 0) {
    std::_Rb_tree_iterator<std::pair<const_OutputType,_wallet::Groups>_>::operator*
              ((_Rb_tree_iterator<std::pair<const_OutputType,_wallet::Groups>_> *)
               in_stack_fffffffffffffe58);
    std::get<0ul,OutputType_const,wallet::Groups>
              ((pair<const_OutputType,_wallet::Groups> *)in_stack_fffffffffffffe58);
    std::get<1ul,OutputType_const,wallet::Groups>
              ((pair<const_OutputType,_wallet::Groups> *)in_stack_fffffffffffffe58);
    bVar2 = false;
    ChooseSelectionResult
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
               in_stack_ffffffffffffff88);
    in_stack_fffffffffffffe8f = HasErrorMsg(in_stack_fffffffffffffe78);
    if ((bool)in_stack_fffffffffffffe8f) {
      bVar2 = true;
      bVar3 = true;
    }
    else {
      bVar3 = util::Result::operator_cast_to_bool
                        ((Result<wallet::SelectionResult> *)in_stack_fffffffffffffe58);
      if (bVar3) {
        in_stack_fffffffffffffe80._M_current =
             util::Result<wallet::SelectionResult>::operator*(in_stack_fffffffffffffe58);
        std::vector<wallet::SelectionResult,_std::allocator<wallet::SelectionResult>_>::push_back
                  ((vector<wallet::SelectionResult,_std::allocator<wallet::SelectionResult>_> *)
                   in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
      }
      bVar3 = false;
    }
    if (!bVar2) {
      util::Result<wallet::SelectionResult>::~Result
                ((Result<wallet::SelectionResult> *)in_stack_fffffffffffffe58);
    }
    if (bVar3) goto LAB_00a89500;
    std::_Rb_tree_iterator<std::pair<const_OutputType,_wallet::Groups>_>::operator++
              ((_Rb_tree_iterator<std::pair<const_OutputType,_wallet::Groups>_> *)
               in_stack_fffffffffffffe58);
  }
  sVar4 = std::vector<wallet::SelectionResult,_std::allocator<wallet::SelectionResult>_>::size
                    ((vector<wallet::SelectionResult,_std::allocator<wallet::SelectionResult>_> *)
                     in_stack_fffffffffffffe58);
  if (sVar4 == 0) {
    if (((in_R9B & 1) == 0) ||
       (in_stack_fffffffffffffe68 =
             (SelectionResult *)
             OutputGroupTypeMap::TypesCount((OutputGroupTypeMap *)in_stack_fffffffffffffe58),
       in_stack_fffffffffffffe68 < (SelectionResult *)0x2)) {
      local_b8.message.translated.field_2._M_allocated_capacity = 0;
      local_b8.message.translated.field_2._8_8_ = 0;
      local_b8.message.translated._M_dataplus._M_p = (pointer)0x0;
      local_b8.message.translated._M_string_length = 0;
      local_b8.message.original.field_2._M_allocated_capacity = 0;
      local_b8.message.original.field_2._8_8_ = 0;
      local_b8.message.original._M_dataplus._M_p = (pointer)0x0;
      local_b8.message.original._M_string_length = 0;
      error = &local_b8;
      util::Error::Error((Error *)in_stack_fffffffffffffe58);
      util::Result<wallet::SelectionResult>::Result
                ((Result<wallet::SelectionResult> *)in_stack_fffffffffffffe68,error);
      util::Error::~Error((Error *)in_stack_fffffffffffffe58);
    }
    else {
      ChooseSelectionResult
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                 in_stack_ffffffffffffff88);
    }
  }
  else {
    std::vector<wallet::SelectionResult,_std::allocator<wallet::SelectionResult>_>::begin
              ((vector<wallet::SelectionResult,_std::allocator<wallet::SelectionResult>_> *)
               in_stack_fffffffffffffe60);
    std::vector<wallet::SelectionResult,_std::allocator<wallet::SelectionResult>_>::end
              ((vector<wallet::SelectionResult,_std::allocator<wallet::SelectionResult>_> *)
               in_stack_fffffffffffffe60);
    __first._M_current._7_1_ = in_stack_fffffffffffffe8f;
    __first._M_current._0_7_ = in_stack_fffffffffffffe88;
    std::
    min_element<__gnu_cxx::__normal_iterator<wallet::SelectionResult*,std::vector<wallet::SelectionResult,std::allocator<wallet::SelectionResult>>>>
              (__first,in_stack_fffffffffffffe80);
    __gnu_cxx::
    __normal_iterator<wallet::SelectionResult_*,_std::vector<wallet::SelectionResult,_std::allocator<wallet::SelectionResult>_>_>
    ::operator*((__normal_iterator<wallet::SelectionResult_*,_std::vector<wallet::SelectionResult,_std::allocator<wallet::SelectionResult>_>_>
                 *)in_stack_fffffffffffffe58);
    SelectionResult::SelectionResult(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
    util::Result<wallet::SelectionResult>::Result
              ((Result<wallet::SelectionResult> *)in_stack_fffffffffffffe68,
               in_stack_fffffffffffffe60);
    SelectionResult::~SelectionResult(in_stack_fffffffffffffe58);
  }
LAB_00a89500:
  std::vector<wallet::SelectionResult,_std::allocator<wallet::SelectionResult>_>::~vector
            ((vector<wallet::SelectionResult,_std::allocator<wallet::SelectionResult>_> *)
             in_stack_fffffffffffffe68);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

util::Result<SelectionResult> AttemptSelection(interfaces::Chain& chain, const CAmount& nTargetValue, OutputGroupTypeMap& groups,
                               const CoinSelectionParams& coin_selection_params, bool allow_mixed_output_types)
{
    // Run coin selection on each OutputType and compute the Waste Metric
    std::vector<SelectionResult> results;
    for (auto& [type, group] : groups.groups_by_type) {
        auto result{ChooseSelectionResult(chain, nTargetValue, group, coin_selection_params)};
        // If any specific error message appears here, then something particularly wrong happened.
        if (HasErrorMsg(result)) return result; // So let's return the specific error.
        // Append the favorable result.
        if (result) results.push_back(*result);
    }
    // If we have at least one solution for funding the transaction without mixing, choose the minimum one according to waste metric
    // and return the result
    if (results.size() > 0) return *std::min_element(results.begin(), results.end());

    // If we can't fund the transaction from any individual OutputType, run coin selection one last time
    // over all available coins, which would allow mixing.
    // If TypesCount() <= 1, there is nothing to mix.
    if (allow_mixed_output_types && groups.TypesCount() > 1) {
        return ChooseSelectionResult(chain, nTargetValue, groups.all_groups, coin_selection_params);
    }
    // Either mixing is not allowed and we couldn't find a solution from any single OutputType, or mixing was allowed and we still couldn't
    // find a solution using all available coins
    return util::Error();
}